

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O2

void add_intrinsic_4f_s1_4f(Context_conflict *ctx,char *fn)

{
  MOJOSHADER_astDataType *ret;
  
  ret = get_usertype(ctx,"float4");
  add_intrinsic2(ctx,fn,ret,&ctx->dt_sampler1d,ret);
  return;
}

Assistant:

static void add_intrinsic_4f_s1_4f(Context *ctx, const char *fn)
{
    const MOJOSHADER_astDataType *dt = get_usertype(ctx, "float4");
    add_intrinsic2(ctx, fn, dt, &ctx->dt_sampler1d, dt);
}